

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_http(Curl_easy *data,_Bool *done)

{
  size_t sVar1;
  CURLcode CVar2;
  int iVar3;
  char *pcVar4;
  bool bVar5;
  char *local_170;
  char *local_160;
  char *local_150;
  char *local_140;
  char *local_130;
  char *local_120;
  char *local_110;
  char *local_100;
  char *local_f0;
  char *local_e0;
  char *local_b8;
  char *pq;
  char *p_accept;
  char *altused;
  dynbuf req;
  char *httpstring;
  char *request;
  char *te;
  long lStack_60;
  Curl_HttpReq httpreq;
  HTTP *http;
  connectdata *pcStack_50;
  CURLcode result;
  connectdata *conn;
  _Bool *done_local;
  Curl_easy *data_local;
  
  pcStack_50 = data->conn;
  http._4_4_ = 0;
  request = "";
  *done = true;
  conn = (connectdata *)done;
  done_local = (_Bool *)data;
  if (pcStack_50->transport != '\x05') {
    if (pcStack_50->httpversion < 0x14) {
      if (pcStack_50->alpn != '\x02') {
        if (pcStack_50->alpn == '\x03') {
          pcStack_50->httpversion = '\x14';
          CVar2 = Curl_http2_switched(data,(char *)0x0,0);
          if (CVar2 != CURLE_OK) {
            return CVar2;
          }
          http._4_4_ = 0;
        }
        else {
          if ((data->state).httpwant == '\x05') {
            if (((*(uint *)&(pcStack_50->bits).field_0x4 & 1) != 0) &&
               ((*(uint *)&(pcStack_50->bits).field_0x4 >> 3 & 1) == 0)) {
              Curl_infof(data,"Ignoring HTTP/2 prior knowledge due to proxy");
              goto LAB_0094743b;
            }
            pcStack_50->httpversion = '\x14';
            CVar2 = Curl_http2_switched(data,(char *)0x0,0);
            if (CVar2 != CURLE_OK) {
              return CVar2;
            }
          }
          http._4_4_ = 0;
        }
      }
    }
    else {
      CVar2 = Curl_http2_setup(data,pcStack_50);
      if (CVar2 != CURLE_OK) {
        return CVar2;
      }
      http._4_4_ = 0;
    }
  }
LAB_0094743b:
  lStack_60 = *(long *)(done_local + 0x198);
  http._4_4_ = Curl_http_host((Curl_easy *)done_local,pcStack_50);
  data_local._4_4_ = http._4_4_;
  if ((http._4_4_ == CURLE_OK) &&
     (http._4_4_ = Curl_http_useragent((Curl_easy *)done_local), data_local._4_4_ = http._4_4_,
     http._4_4_ == CURLE_OK)) {
    Curl_http_method((Curl_easy *)done_local,pcStack_50,&httpstring,(Curl_HttpReq *)((long)&te + 4))
    ;
    local_b8 = (char *)0x0;
    if ((*(long *)(done_local + 0x11d8) == 0) ||
       (local_b8 = curl_maprintf("%s?%s",*(undefined8 *)(done_local + 0x11d0),
                                 *(undefined8 *)(done_local + 0x11d8)), local_b8 != (char *)0x0)) {
      if (local_b8 == (char *)0x0) {
        local_e0 = *(char **)(done_local + 0x11d0);
      }
      else {
        local_e0 = local_b8;
      }
      http._4_4_ = Curl_http_output_auth
                             ((Curl_easy *)done_local,pcStack_50,httpstring,te._4_4_,local_e0,false)
      ;
      (*Curl_cfree)(local_b8);
      if (http._4_4_ == CURLE_OK) {
        (*Curl_cfree)(*(void **)(done_local + 0x12b8));
        done_local[0x12b8] = false;
        done_local[0x12b9] = false;
        done_local[0x12ba] = false;
        done_local[0x12bb] = false;
        done_local[0x12bc] = false;
        done_local[0x12bd] = false;
        done_local[0x12be] = false;
        done_local[0x12bf] = false;
        if ((*(long *)(done_local + 0x11f0) != 0) &&
           (pcVar4 = Curl_checkheaders((Curl_easy *)done_local,"Referer",7), pcVar4 == (char *)0x0))
        {
          pcVar4 = curl_maprintf("Referer: %s\r\n",*(undefined8 *)(done_local + 0x11f0));
          *(char **)(done_local + 0x12b8) = pcVar4;
          if (*(long *)(done_local + 0x12b8) == 0) {
            return CURLE_OUT_OF_MEMORY;
          }
        }
        pcVar4 = Curl_checkheaders((Curl_easy *)done_local,"Accept-Encoding",0xf);
        if ((pcVar4 == (char *)0x0) && (*(long *)(done_local + 0x778) != 0)) {
          (*Curl_cfree)(*(void **)(done_local + 0x12a0));
          done_local[0x12a0] = false;
          done_local[0x12a1] = false;
          done_local[0x12a2] = false;
          done_local[0x12a3] = false;
          done_local[0x12a4] = false;
          done_local[0x12a5] = false;
          done_local[0x12a6] = false;
          done_local[0x12a7] = false;
          pcVar4 = curl_maprintf("Accept-Encoding: %s\r\n",*(undefined8 *)(done_local + 0x778));
          *(char **)(done_local + 0x12a0) = pcVar4;
          if (*(long *)(done_local + 0x12a0) == 0) {
            return CURLE_OUT_OF_MEMORY;
          }
        }
        else {
          (*Curl_cfree)(*(void **)(done_local + 0x12a0));
          done_local[0x12a0] = false;
          done_local[0x12a1] = false;
          done_local[0x12a2] = false;
          done_local[0x12a3] = false;
          done_local[0x12a4] = false;
          done_local[0x12a5] = false;
          done_local[0x12a6] = false;
          done_local[0x12a7] = false;
        }
        http._4_4_ = Curl_transferencode((Curl_easy *)done_local);
        data_local._4_4_ = http._4_4_;
        if ((http._4_4_ == CURLE_OK) &&
           (http._4_4_ = Curl_http_body((Curl_easy *)done_local,pcStack_50,te._4_4_,&request),
           data_local._4_4_ = http._4_4_, http._4_4_ == CURLE_OK)) {
          pcVar4 = Curl_checkheaders((Curl_easy *)done_local,"Accept",6);
          local_140 = "Accept: */*\r\n";
          if (pcVar4 != (char *)0x0) {
            local_140 = (char *)0x0;
          }
          http._4_4_ = Curl_http_resume((Curl_easy *)done_local,pcStack_50,te._4_4_);
          data_local._4_4_ = http._4_4_;
          if ((http._4_4_ == CURLE_OK) &&
             (http._4_4_ = Curl_http_range((Curl_easy *)done_local,te._4_4_),
             data_local._4_4_ = http._4_4_, http._4_4_ == CURLE_OK)) {
            req.toobig = (size_t)get_http_string((Curl_easy *)done_local,pcStack_50);
            Curl_dyn_init((dynbuf *)&altused,0x100000);
            Curl_dyn_reset((dynbuf *)(done_local + 0xc50));
            http._4_4_ = Curl_dyn_addf((dynbuf *)&altused,"%s ",httpstring);
            if (http._4_4_ == CURLE_OK) {
              http._4_4_ = Curl_http_target((Curl_easy *)done_local,pcStack_50,(dynbuf *)&altused);
            }
            sVar1 = req.toobig;
            if (http._4_4_ == CURLE_OK) {
              if (*(long *)(done_local + 0x12c0) == 0) {
                local_f0 = "";
              }
              else {
                local_f0 = *(char **)(done_local + 0x12c0);
              }
              if (*(long *)(done_local + 0x1290) == 0) {
                local_100 = "";
              }
              else {
                local_100 = *(char **)(done_local + 0x1290);
              }
              if (*(long *)(done_local + 0x12a8) == 0) {
                local_110 = "";
              }
              else {
                local_110 = *(char **)(done_local + 0x12a8);
              }
              if (((*(uint *)(done_local + 0x1300) >> 9 & 1) == 0) ||
                 (*(long *)(done_local + 0x12b0) == 0)) {
                local_120 = "";
              }
              else {
                local_120 = *(char **)(done_local + 0x12b0);
              }
              if (((*(long *)(done_local + 0x850) == 0) || (**(char **)(done_local + 0x850) == '\0')
                  ) || (*(long *)(done_local + 0x1298) == 0)) {
                local_130 = "";
              }
              else {
                local_130 = *(char **)(done_local + 0x1298);
              }
              if (local_140 == (char *)0x0) {
                local_140 = "";
              }
              if (*(long *)(done_local + 0x12d8) == 0) {
                local_150 = "";
              }
              else {
                local_150 = *(char **)(done_local + 0x12d8);
              }
              if (((*(long *)(done_local + 0x778) == 0) || (**(char **)(done_local + 0x778) == '\0')
                  ) || (*(long *)(done_local + 0x12a0) == 0)) {
                local_160 = "";
              }
              else {
                local_160 = *(char **)(done_local + 0x12a0);
              }
              if ((*(long *)(done_local + 0x11f0) == 0) || (*(long *)(done_local + 0x12b8) == 0)) {
                local_170 = "";
              }
              else {
                local_170 = *(char **)(done_local + 0x12b8);
              }
              bVar5 = false;
              if (((*(uint *)&(pcStack_50->bits).field_0x4 & 1) != 0) &&
                 (bVar5 = false, (*(uint *)&(pcStack_50->bits).field_0x4 >> 3 & 1) == 0)) {
                pcVar4 = Curl_checkheaders((Curl_easy *)done_local,"Proxy-Connection",0x10);
                bVar5 = false;
                if (pcVar4 == (char *)0x0) {
                  pcVar4 = Curl_checkProxyheaders
                                     ((Curl_easy *)done_local,pcStack_50,"Proxy-Connection",0x10);
                  bVar5 = pcVar4 == (char *)0x0;
                }
              }
              pcVar4 = "";
              if (bVar5) {
                pcVar4 = "Proxy-Connection: Keep-Alive\r\n";
              }
              http._4_4_ = Curl_dyn_addf((dynbuf *)&altused," HTTP/%s\r\n%s%s%s%s%s%s%s%s%s%s%s%s",
                                         sVar1,local_f0,local_100,local_110,local_120,local_130,
                                         local_140,local_150,local_160,local_170,pcVar4,request,"");
              (*Curl_cfree)(*(void **)(done_local + 0x12a8));
              done_local[0x12a8] = false;
              done_local[0x12a9] = false;
              done_local[0x12aa] = false;
              done_local[0x12ab] = false;
              done_local[0x12ac] = false;
              done_local[0x12ad] = false;
              done_local[0x12ae] = false;
              done_local[0x12af] = false;
              (*Curl_cfree)(*(void **)(done_local + 0x1290));
              done_local[0x1290] = false;
              done_local[0x1291] = false;
              done_local[0x1292] = false;
              done_local[0x1293] = false;
              done_local[0x1294] = false;
              done_local[0x1295] = false;
              done_local[0x1296] = false;
              done_local[0x1297] = false;
              (*Curl_cfree)((void *)0x0);
              if (http._4_4_ == CURLE_OK) {
                if ((((pcStack_50->handler->flags & 1) == 0) && (pcStack_50->httpversion != '\x14'))
                   && (done_local[0x1148] == true)) {
                  http._4_4_ = Curl_http2_request_upgrade
                                         ((dynbuf *)&altused,(Curl_easy *)done_local);
                  if (http._4_4_ != CURLE_OK) {
                    Curl_dyn_free((dynbuf *)&altused);
                    return http._4_4_;
                  }
                  http._4_4_ = CURLE_OK;
                }
                http._4_4_ = Curl_http_cookies((Curl_easy *)done_local,pcStack_50,(dynbuf *)&altused
                                              );
                if (http._4_4_ == CURLE_OK) {
                  http._4_4_ = Curl_add_timecondition((Curl_easy *)done_local,(dynbuf *)&altused);
                }
                if (http._4_4_ == CURLE_OK) {
                  http._4_4_ = Curl_add_custom_headers
                                         ((Curl_easy *)done_local,false,(dynbuf *)&altused);
                }
                if (http._4_4_ == CURLE_OK) {
                  *(undefined8 *)(lStack_60 + 0x10) = 0;
                  if ((te._4_4_ == HTTPREQ_GET) || (te._4_4_ == HTTPREQ_HEAD)) {
                    Curl_pgrsSetUploadSize((Curl_easy *)done_local,0);
                  }
                  http._4_4_ = Curl_http_bodysend((Curl_easy *)done_local,pcStack_50,
                                                  (dynbuf *)&altused,te._4_4_);
                }
                if (http._4_4_ == CURLE_OK) {
                  if (((-1 < *(long *)(lStack_60 + 8)) &&
                      (*(long *)(lStack_60 + 8) <= *(long *)(done_local + 0xe8))) &&
                     (*(int *)(lStack_60 + 0x200) != 1)) {
                    *(ushort *)(done_local + 0x1a9) = *(ushort *)(done_local + 0x1a9) & 0xfffb | 4;
                  }
                  if (*(long *)(done_local + 0xe8) != 0) {
                    Curl_pgrsSetUploadCounter
                              ((Curl_easy *)done_local,*(curl_off_t *)(done_local + 0xe8));
                    iVar3 = Curl_pgrsUpdate((Curl_easy *)done_local);
                    if (iVar3 != 0) {
                      http._4_4_ = CURLE_ABORTED_BY_CALLBACK;
                    }
                    if (*(long *)(lStack_60 + 8) == 0) {
                      Curl_infof((Curl_easy *)done_local,
                                 "upload completely sent off: %ld out of %ld bytes",
                                 *(undefined8 *)(done_local + 0xe8),*(undefined8 *)(lStack_60 + 8));
                      *(ushort *)(done_local + 0x1a9) = *(ushort *)(done_local + 0x1a9) & 0xfffb | 4
                      ;
                      *(uint *)(done_local + 0x144) = *(uint *)(done_local + 0x144) & 0xfffffffd;
                      done_local[0x158] = false;
                      done_local[0x159] = false;
                      done_local[0x15a] = false;
                      done_local[0x15b] = false;
                      Curl_expire_done((Curl_easy *)done_local,EXPIRE_100_TIMEOUT);
                    }
                  }
                  if ((pcStack_50->httpversion == '\x14') &&
                     ((*(ushort *)(done_local + 0x1a9) >> 7 & 1) != 0)) {
                    *(ushort *)(done_local + 0x1a9) = *(ushort *)(done_local + 0x1a9) & 0xff7f;
                  }
                  data_local._4_4_ = http._4_4_;
                }
                else {
                  Curl_dyn_free((dynbuf *)&altused);
                  data_local._4_4_ = http._4_4_;
                }
              }
              else {
                Curl_dyn_free((dynbuf *)&altused);
                data_local._4_4_ = http._4_4_;
              }
            }
            else {
              Curl_dyn_free((dynbuf *)&altused);
              data_local._4_4_ = http._4_4_;
            }
          }
        }
      }
      else {
        data_local._4_4_ = http._4_4_;
      }
    }
    else {
      data_local._4_4_ = CURLE_OUT_OF_MEMORY;
    }
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_http(struct Curl_easy *data, bool *done)
{
  struct connectdata *conn = data->conn;
  CURLcode result = CURLE_OK;
  struct HTTP *http;
  Curl_HttpReq httpreq;
  const char *te = ""; /* transfer-encoding */
  const char *request;
  const char *httpstring;
  struct dynbuf req;
  char *altused = NULL;
  const char *p_accept;      /* Accept: string */

  /* Always consider the DO phase done after this function call, even if there
     may be parts of the request that are not yet sent, since we can deal with
     the rest of the request in the PERFORM phase. */
  *done = TRUE;

  if(conn->transport != TRNSPRT_QUIC) {
    if(conn->httpversion < 20) { /* unless the connection is re-used and
                                    already http2 */
      switch(conn->alpn) {
      case CURL_HTTP_VERSION_2:
        conn->httpversion = 20; /* we know we're on HTTP/2 now */

        result = Curl_http2_switched(data, NULL, 0);
        if(result)
          return result;
        break;
      case CURL_HTTP_VERSION_1_1:
        /* continue with HTTP/1.1 when explicitly requested */
        break;
      default:
        /* Check if user wants to use HTTP/2 with clear TCP*/
#ifdef USE_NGHTTP2
        if(data->state.httpwant == CURL_HTTP_VERSION_2_PRIOR_KNOWLEDGE) {
#ifndef CURL_DISABLE_PROXY
          if(conn->bits.httpproxy && !conn->bits.tunnel_proxy) {
            /* We don't support HTTP/2 proxies yet. Also it's debatable
               whether or not this setting should apply to HTTP/2 proxies. */
            infof(data, "Ignoring HTTP/2 prior knowledge due to proxy");
            break;
          }
#endif
          DEBUGF(infof(data, "HTTP/2 over clean TCP"));
          conn->httpversion = 20;

          result = Curl_http2_switched(data, NULL, 0);
          if(result)
            return result;
        }
#endif
        break;
      }
    }
    else {
      /* prepare for a http2 request */
      result = Curl_http2_setup(data, conn);
      if(result)
        return result;
    }
  }
  http = data->req.p.http;
  DEBUGASSERT(http);

  result = Curl_http_host(data, conn);
  if(result)
    return result;

  result = Curl_http_useragent(data);
  if(result)
    return result;

  Curl_http_method(data, conn, &request, &httpreq);

  /* setup the authentication headers */
  {
    char *pq = NULL;
    if(data->state.up.query) {
      pq = aprintf("%s?%s", data->state.up.path, data->state.up.query);
      if(!pq)
        return CURLE_OUT_OF_MEMORY;
    }
    result = Curl_http_output_auth(data, conn, request, httpreq,
                                   (pq ? pq : data->state.up.path), FALSE);
    free(pq);
    if(result)
      return result;
  }

  Curl_safefree(data->state.aptr.ref);
  if(data->state.referer && !Curl_checkheaders(data, STRCONST("Referer"))) {
    data->state.aptr.ref = aprintf("Referer: %s\r\n", data->state.referer);
    if(!data->state.aptr.ref)
      return CURLE_OUT_OF_MEMORY;
  }

  if(!Curl_checkheaders(data, STRCONST("Accept-Encoding")) &&
     data->set.str[STRING_ENCODING]) {
    Curl_safefree(data->state.aptr.accept_encoding);
    data->state.aptr.accept_encoding =
      aprintf("Accept-Encoding: %s\r\n", data->set.str[STRING_ENCODING]);
    if(!data->state.aptr.accept_encoding)
      return CURLE_OUT_OF_MEMORY;
  }
  else
    Curl_safefree(data->state.aptr.accept_encoding);

#ifdef HAVE_LIBZ
  /* we only consider transfer-encoding magic if libz support is built-in */
  result = Curl_transferencode(data);
  if(result)
    return result;
#endif

  result = Curl_http_body(data, conn, httpreq, &te);
  if(result)
    return result;

  p_accept = Curl_checkheaders(data,
                               STRCONST("Accept"))?NULL:"Accept: */*\r\n";

  result = Curl_http_resume(data, conn, httpreq);
  if(result)
    return result;

  result = Curl_http_range(data, httpreq);
  if(result)
    return result;

  httpstring = get_http_string(data, conn);

  /* initialize a dynamic send-buffer */
  Curl_dyn_init(&req, DYN_HTTP_REQUEST);

  /* make sure the header buffer is reset - if there are leftovers from a
     previous transfer */
  Curl_dyn_reset(&data->state.headerb);

  /* add the main request stuff */
  /* GET/HEAD/POST/PUT */
  result = Curl_dyn_addf(&req, "%s ", request);
  if(!result)
    result = Curl_http_target(data, conn, &req);
  if(result) {
    Curl_dyn_free(&req);
    return result;
  }

#ifndef CURL_DISABLE_ALTSVC
  if(conn->bits.altused && !Curl_checkheaders(data, STRCONST("Alt-Used"))) {
    altused = aprintf("Alt-Used: %s:%d\r\n",
                      conn->conn_to_host.name, conn->conn_to_port);
    if(!altused) {
      Curl_dyn_free(&req);
      return CURLE_OUT_OF_MEMORY;
    }
  }
#endif
  result =
    Curl_dyn_addf(&req,
                  " HTTP/%s\r\n" /* HTTP version */
                  "%s" /* host */
                  "%s" /* proxyuserpwd */
                  "%s" /* userpwd */
                  "%s" /* range */
                  "%s" /* user agent */
                  "%s" /* accept */
                  "%s" /* TE: */
                  "%s" /* accept-encoding */
                  "%s" /* referer */
                  "%s" /* Proxy-Connection */
                  "%s" /* transfer-encoding */
                  "%s",/* Alt-Used */

                  httpstring,
                  (data->state.aptr.host?data->state.aptr.host:""),
                  data->state.aptr.proxyuserpwd?
                  data->state.aptr.proxyuserpwd:"",
                  data->state.aptr.userpwd?data->state.aptr.userpwd:"",
                  (data->state.use_range && data->state.aptr.rangeline)?
                  data->state.aptr.rangeline:"",
                  (data->set.str[STRING_USERAGENT] &&
                   *data->set.str[STRING_USERAGENT] &&
                   data->state.aptr.uagent)?
                  data->state.aptr.uagent:"",
                  p_accept?p_accept:"",
                  data->state.aptr.te?data->state.aptr.te:"",
                  (data->set.str[STRING_ENCODING] &&
                   *data->set.str[STRING_ENCODING] &&
                   data->state.aptr.accept_encoding)?
                  data->state.aptr.accept_encoding:"",
                  (data->state.referer && data->state.aptr.ref)?
                  data->state.aptr.ref:"" /* Referer: <data> */,
#ifndef CURL_DISABLE_PROXY
                  (conn->bits.httpproxy &&
                   !conn->bits.tunnel_proxy &&
                   !Curl_checkheaders(data, STRCONST("Proxy-Connection")) &&
                   !Curl_checkProxyheaders(data,
                                           conn,
                                           STRCONST("Proxy-Connection")))?
                  "Proxy-Connection: Keep-Alive\r\n":"",
#else
                  "",
#endif
                  te,
                  altused ? altused : ""
      );

  /* clear userpwd and proxyuserpwd to avoid re-using old credentials
   * from re-used connections */
  Curl_safefree(data->state.aptr.userpwd);
  Curl_safefree(data->state.aptr.proxyuserpwd);
  free(altused);

  if(result) {
    Curl_dyn_free(&req);
    return result;
  }

  if(!(conn->handler->flags&PROTOPT_SSL) &&
     conn->httpversion != 20 &&
     (data->state.httpwant == CURL_HTTP_VERSION_2)) {
    /* append HTTP2 upgrade magic stuff to the HTTP request if it isn't done
       over SSL */
    result = Curl_http2_request_upgrade(&req, data);
    if(result) {
      Curl_dyn_free(&req);
      return result;
    }
  }

  result = Curl_http_cookies(data, conn, &req);
  if(!result && conn->handler->protocol&(CURLPROTO_WS|CURLPROTO_WSS))
    result = Curl_ws_request(data, &req);
  if(!result)
    result = Curl_add_timecondition(data, &req);
  if(!result)
    result = Curl_add_custom_headers(data, FALSE, &req);

  if(!result) {
    http->postdata = NULL;  /* nothing to post at this point */
    if((httpreq == HTTPREQ_GET) ||
       (httpreq == HTTPREQ_HEAD))
      Curl_pgrsSetUploadSize(data, 0); /* nothing */

    /* bodysend takes ownership of the 'req' memory on success */
    result = Curl_http_bodysend(data, conn, &req, httpreq);
  }
  if(result) {
    Curl_dyn_free(&req);
    return result;
  }

  if((http->postsize > -1) &&
     (http->postsize <= data->req.writebytecount) &&
     (http->sending != HTTPSEND_REQUEST))
    data->req.upload_done = TRUE;

  if(data->req.writebytecount) {
    /* if a request-body has been sent off, we make sure this progress is noted
       properly */
    Curl_pgrsSetUploadCounter(data, data->req.writebytecount);
    if(Curl_pgrsUpdate(data))
      result = CURLE_ABORTED_BY_CALLBACK;

    if(!http->postsize) {
      /* already sent the entire request body, mark the "upload" as
         complete */
      infof(data, "upload completely sent off: %" CURL_FORMAT_CURL_OFF_T
            " out of %" CURL_FORMAT_CURL_OFF_T " bytes",
            data->req.writebytecount, http->postsize);
      data->req.upload_done = TRUE;
      data->req.keepon &= ~KEEP_SEND; /* we're done writing */
      data->req.exp100 = EXP100_SEND_DATA; /* already sent */
      Curl_expire_done(data, EXPIRE_100_TIMEOUT);
    }
  }

  if((conn->httpversion == 20) && data->req.upload_chunky)
    /* upload_chunky was set above to set up the request in a chunky fashion,
       but is disabled here again to avoid that the chunked encoded version is
       actually used when sending the request body over h2 */
    data->req.upload_chunky = FALSE;
  return result;
}